

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::UpdatePositions(CGameClient *this)

{
  long lVar1;
  CNetObj_SpectatorInfo *pCVar2;
  int iVar3;
  IClient *pIVar4;
  IDemoPlayer *pIVar5;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  vec2 vVar6;
  vector2_base<float> vVar7;
  undefined4 in_stack_ffffffffffffffb0;
  CGameClient *this_00;
  float amount;
  vec2 local_38;
  vector2_base<float> local_30;
  vector2_base<float> local_28;
  vector2_base<float> in_stack_ffffffffffffffe0;
  vector2_base<float> in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (((in_RDI->m_Snap).m_pLocalCharacter != (CNetObj_Character *)0x0) &&
     ((in_RDI->m_Snap).m_pLocalPrevCharacter != (CNetObj_Character *)0x0)) {
    ShouldUsePredicted((CGameClient *)CONCAT44(in_RDI->m_LocalClientID,in_stack_ffffffffffffffb0));
    vVar6 = GetCharPos(this_00,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    in_RDI->m_LocalCharacterPos = vVar6;
  }
  if (((in_RDI->m_Snap).m_SpecInfo.m_Active & 1U) != 0) {
    pIVar4 = Client(in_RDI);
    iVar3 = IClient::State(pIVar4);
    if (iVar3 == 4) {
      pIVar5 = DemoPlayer(in_RDI);
      iVar3 = (*(pIVar5->super_IInterface)._vptr_IInterface[10])();
      if ((iVar3 == 2) && ((in_RDI->m_Snap).m_SpecInfo.m_SpectatorID != -1)) {
        vVar6 = GetCharPos(this_00,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
        (in_RDI->m_Snap).m_SpecInfo.m_Position = vVar6;
        in_RDI->m_LocalCharacterPos = (in_RDI->m_Snap).m_SpecInfo.m_Position;
        (in_RDI->m_Snap).m_SpecInfo.m_UsePosition = true;
        goto LAB_001cbd77;
      }
    }
    amount = (float)((ulong)this_00 >> 0x20);
    if ((in_RDI->m_Snap).m_pSpectatorInfo != (CNetObj_SpectatorInfo *)0x0) {
      pIVar4 = Client(in_RDI);
      iVar3 = IClient::State(pIVar4);
      if (((iVar3 == 4) || ((in_RDI->m_Snap).m_SpecInfo.m_SpecMode != 0)) ||
         (((in_RDI->m_Snap).m_pLocalInfo != (CNetObj_PlayerInfo *)0x0 &&
          (((((in_RDI->m_Snap).m_pLocalInfo)->m_PlayerFlags & 0x10U) != 0 &&
           ((in_RDI->m_Snap).m_SpecInfo.m_SpecMode != 0)))))) {
        if ((in_RDI->m_Snap).m_pPrevSpectatorInfo == (CNetObj_SpectatorInfo *)0x0) {
          vector2_base<float>::vector2_base
                    (&local_38,(float)((in_RDI->m_Snap).m_pSpectatorInfo)->m_X,
                     (float)((in_RDI->m_Snap).m_pSpectatorInfo)->m_Y);
          (in_RDI->m_Snap).m_SpecInfo.m_Position = local_38;
        }
        else {
          pCVar2 = (in_RDI->m_Snap).m_pPrevSpectatorInfo;
          vector2_base<float>::vector2_base(&local_28,(float)pCVar2->m_X,(float)pCVar2->m_Y);
          pCVar2 = (in_RDI->m_Snap).m_pSpectatorInfo;
          vector2_base<float>::vector2_base(&local_30,(float)pCVar2->m_X,(float)pCVar2->m_Y);
          pIVar4 = Client(in_RDI);
          IClient::IntraGameTick(pIVar4);
          vVar7 = mix<vector2_base<float>,float>
                            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,amount);
          (in_RDI->m_Snap).m_SpecInfo.m_Position.field_0 = vVar7.field_0;
          (in_RDI->m_Snap).m_SpecInfo.m_Position.field_1 = vVar7.field_1;
        }
        in_RDI->m_LocalCharacterPos = (in_RDI->m_Snap).m_SpecInfo.m_Position;
        (in_RDI->m_Snap).m_SpecInfo.m_UsePosition = true;
      }
    }
  }
LAB_001cbd77:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::UpdatePositions()
{
	// `m_LocalCharacterPos` is used for many things besides rendering the
	// player (e.g. camera position, mouse input), which is why we set it here.
	if(m_Snap.m_pLocalCharacter && m_Snap.m_pLocalPrevCharacter)
	{
		m_LocalCharacterPos = GetCharPos(m_LocalClientID, ShouldUsePredicted());
	}

	// spectator position
	if(m_Snap.m_SpecInfo.m_Active)
	{
		if(Client()->State() == IClient::STATE_DEMOPLAYBACK &&
			DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER &&
			m_Snap.m_SpecInfo.m_SpectatorID != -1)
		{
			m_Snap.m_SpecInfo.m_Position = GetCharPos(m_Snap.m_SpecInfo.m_SpectatorID);
			m_LocalCharacterPos = m_Snap.m_SpecInfo.m_Position;
			m_Snap.m_SpecInfo.m_UsePosition = true;
		}
		else if(
			m_Snap.m_pSpectatorInfo &&
			(
				Client()->State() == IClient::STATE_DEMOPLAYBACK ||
				m_Snap.m_SpecInfo.m_SpecMode != SPEC_FREEVIEW ||
				(
					m_Snap.m_pLocalInfo &&
					(m_Snap.m_pLocalInfo->m_PlayerFlags & PLAYERFLAG_DEAD) &&
					m_Snap.m_SpecInfo.m_SpecMode != SPEC_FREEVIEW
				)
			))
		{
			if(m_Snap.m_pPrevSpectatorInfo)
				m_Snap.m_SpecInfo.m_Position = mix(
					vec2(
						m_Snap.m_pPrevSpectatorInfo->m_X,
						m_Snap.m_pPrevSpectatorInfo->m_Y
					),
					vec2(
						m_Snap.m_pSpectatorInfo->m_X,
						m_Snap.m_pSpectatorInfo->m_Y
					),
					Client()->IntraGameTick()
				);
			else
				m_Snap.m_SpecInfo.m_Position = vec2(
					m_Snap.m_pSpectatorInfo->m_X,
					m_Snap.m_pSpectatorInfo->m_Y
				);

			m_LocalCharacterPos = m_Snap.m_SpecInfo.m_Position;
			m_Snap.m_SpecInfo.m_UsePosition = true;
		}
	}
}